

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  CallInfo *pCVar1;
  StkId pTVar2;
  StkId pTVar3;
  int iVar4;
  undefined4 uVar5;
  char *pcVar6;
  StkId pos;
  StkId local_10;
  
  local_10 = (StkId)0x0;
  if (L->status == '\x01') {
    pCVar1 = L->ci;
    pTVar2 = L->stack;
    pTVar3 = pCVar1->func;
    pCVar1->func = (StkId)((long)&pTVar2->value_ + pCVar1->extra);
    pCVar1->extra = (long)pTVar3 - (long)pTVar2;
  }
  pcVar6 = findlocal(L,ar->i_ci,n,&local_10);
  if (pcVar6 != (char *)0x0) {
    pTVar2 = L->top;
    iVar4 = pTVar2[-1].tt_;
    uVar5 = *(undefined4 *)&pTVar2[-1].field_0xc;
    local_10->value_ = pTVar2[-1].value_;
    local_10->tt_ = iVar4;
    *(undefined4 *)&local_10->field_0xc = uVar5;
    L->top = L->top + -1;
  }
  if (L->status == '\x01') {
    pCVar1 = L->ci;
    pTVar2 = L->stack;
    pTVar3 = pCVar1->func;
    pCVar1->func = (StkId)((long)&pTVar2->value_ + pCVar1->extra);
    pCVar1->extra = (long)pTVar3 - (long)pTVar2;
  }
  return pcVar6;
}

Assistant:

LUA_API const char *lua_setlocal(lua_State *L, const lua_Debug *ar, int n) {
    StkId pos = NULL;  /* to avoid warnings */
    const char *name;
    lua_lock(L);
    swapextra(L);
    name = findlocal(L, ar->i_ci, n, &pos);
    if (name) {
        setobjs2s(L, pos, L->top - 1);
        L->top--;  /* pop value */
    }
    swapextra(L);
    lua_unlock(L);
    return name;
}